

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<char> * __thiscall
cimg_library::CImg<char>::get_crop
          (CImg<char> *__return_storage_ptr__,CImg<char> *this,int x0,int y0,int z0,int c0,int x1,
          int y1,int z1,int c1,uint boundary_conditions)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  CImgInstanceException *this_00;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  CImg<char> *this_01;
  uint local_148;
  uint local_13c;
  uint local_130;
  uint local_124;
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  char local_a9;
  uint local_a8;
  uint local_a4;
  int x_2;
  int y_2;
  int z_2;
  int c_2;
  int x_1;
  int y_1;
  int z_1;
  int c_1;
  int mc;
  int mz;
  int my;
  int mx;
  int x;
  int y;
  int z;
  int c;
  int s2;
  int d2;
  int h2;
  int w2;
  uint local_50;
  int nc1;
  int nc0;
  int nz1;
  int nz0;
  int ny1;
  int ny0;
  int nx1;
  int nx0;
  uint local_28;
  uint local_24;
  int c0_local;
  int z0_local;
  int y0_local;
  int x0_local;
  CImg<char> *this_local;
  CImg<char> *res;
  
  local_28 = c0;
  local_24 = z0;
  c0_local = y0;
  z0_local = x0;
  _y0_local = this;
  this_local = __return_storage_ptr__;
  bVar2 = is_empty(this);
  if (bVar2) {
    this_00 = (CImgInstanceException *)__cxa_allocate_exception(0x10);
    uVar6 = this->_width;
    uVar7 = this->_height;
    uVar8 = this->_depth;
    uVar9 = this->_spectrum;
    pcVar12 = this->_data;
    pcVar10 = "non-";
    if ((this->_is_shared & 1U) != 0) {
      pcVar10 = "";
    }
    pcVar11 = pixel_type();
    CImgInstanceException::CImgInstanceException
              (this_00,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::crop(): Empty instance.",
               (ulong)uVar6,(ulong)uVar7,(ulong)uVar8,(ulong)uVar9,pcVar12,pcVar10,pcVar11);
    __cxa_throw(this_00,&CImgInstanceException::typeinfo,
                CImgInstanceException::~CImgInstanceException);
  }
  if (z0_local < x1) {
    local_fc = z0_local;
  }
  else {
    local_fc = x1;
  }
  ny0 = local_fc;
  ny1 = z0_local ^ x1 ^ local_fc;
  if (c0_local < y1) {
    local_100 = c0_local;
  }
  else {
    local_100 = y1;
  }
  nz0 = local_100;
  nz1 = c0_local ^ y1 ^ local_100;
  if ((int)local_24 < z1) {
    local_104 = local_24;
  }
  else {
    local_104 = z1;
  }
  nc0 = local_104;
  nc1 = local_24 ^ z1 ^ local_104;
  if ((int)local_28 < c1) {
    local_108 = local_28;
  }
  else {
    local_108 = c1;
  }
  local_50 = local_108;
  w2 = local_28 ^ c1 ^ local_108;
  h2._3_1_ = 0;
  CImg(__return_storage_ptr__,(ny1 + 1U) - local_fc,(nz1 + 1U) - local_100,(nc1 + 1U) - local_104,
       (w2 + 1U) - local_108);
  iVar4 = ny1;
  if (((((ny0 < 0) || (iVar3 = width(this), iVar5 = nz1, iVar3 <= iVar4)) || (nz0 < 0)) ||
      ((iVar3 = height(this), iVar4 = nc1, iVar3 <= iVar5 || (nc0 < 0)))) ||
     ((iVar3 = depth(this), iVar5 = w2, iVar3 <= iVar4 ||
      (((int)local_50 < 0 || (iVar4 = spectrum(this), iVar4 <= iVar5)))))) {
    if (boundary_conditions == 1) {
      for (y_2 = 0; y_2 < (int)__return_storage_ptr__->_spectrum; y_2 = y_2 + 1) {
        for (x_2 = 0; x_2 < (int)__return_storage_ptr__->_depth; x_2 = x_2 + 1) {
          for (local_a4 = 0; (int)local_a4 < (int)__return_storage_ptr__->_height;
              local_a4 = local_a4 + 1) {
            for (local_a8 = 0; (int)local_a8 < (int)__return_storage_ptr__->_width;
                local_a8 = local_a8 + 1) {
              pcVar12 = _atXYZC(this,ny0 + local_a8,nz0 + local_a4,nc0 + x_2,local_50 + y_2);
              cVar1 = *pcVar12;
              pcVar12 = operator()(__return_storage_ptr__,local_a8,local_a4,x_2,y_2);
              *pcVar12 = cVar1;
            }
          }
        }
      }
    }
    else if (boundary_conditions == 2) {
      for (y_1 = 0; y_1 < (int)__return_storage_ptr__->_spectrum; y_1 = y_1 + 1) {
        for (x_1 = 0; x_1 < (int)__return_storage_ptr__->_depth; x_1 = x_1 + 1) {
          for (c_2 = 0; c_2 < (int)__return_storage_ptr__->_height; c_2 = c_2 + 1) {
            for (z_2 = 0; z_2 < (int)__return_storage_ptr__->_width; z_2 = z_2 + 1) {
              iVar4 = ny0 + z_2;
              iVar5 = width(this);
              uVar6 = cimg::mod(iVar4,iVar5);
              iVar4 = nz0 + c_2;
              iVar5 = height(this);
              uVar7 = cimg::mod(iVar4,iVar5);
              iVar4 = nc0 + x_1;
              iVar5 = depth(this);
              uVar8 = cimg::mod(iVar4,iVar5);
              iVar4 = local_50 + y_1;
              iVar5 = spectrum(this);
              uVar9 = cimg::mod(iVar4,iVar5);
              pcVar12 = operator()(this,uVar6,uVar7,uVar8,uVar9);
              cVar1 = *pcVar12;
              pcVar12 = operator()(__return_storage_ptr__,z_2,c_2,x_1,y_1);
              *pcVar12 = cVar1;
            }
          }
        }
      }
    }
    else if (boundary_conditions == 3) {
      iVar4 = width(this);
      d2 = iVar4 << 1;
      iVar4 = height(this);
      s2 = iVar4 << 1;
      iVar4 = depth(this);
      c = iVar4 << 1;
      iVar4 = spectrum(this);
      z = iVar4 << 1;
      for (y = 0; y < (int)__return_storage_ptr__->_spectrum; y = y + 1) {
        for (x = 0; x < (int)__return_storage_ptr__->_depth; x = x + 1) {
          for (mx = 0; mx < (int)__return_storage_ptr__->_height; mx = mx + 1) {
            for (my = 0; my < (int)__return_storage_ptr__->_width; my = my + 1) {
              mz = cimg::mod(ny0 + my,d2);
              mc = cimg::mod(nz0 + mx,s2);
              c_1 = cimg::mod(nc0 + x,c);
              z_1 = cimg::mod(local_50 + y,z);
              iVar5 = mz;
              iVar3 = width(this);
              iVar4 = mc;
              if (iVar5 < iVar3) {
                local_124 = mz;
              }
              else {
                local_124 = (d2 - mz) - 1;
              }
              iVar3 = height(this);
              iVar5 = c_1;
              if (iVar4 < iVar3) {
                local_130 = mc;
              }
              else {
                local_130 = (s2 - mc) - 1;
              }
              iVar3 = depth(this);
              iVar4 = z_1;
              if (iVar5 < iVar3) {
                local_13c = c_1;
              }
              else {
                local_13c = (c - c_1) - 1;
              }
              iVar5 = spectrum(this);
              if (iVar4 < iVar5) {
                local_148 = z_1;
              }
              else {
                local_148 = (z - z_1) - 1;
              }
              pcVar12 = operator()(this,local_124,local_130,local_13c,local_148);
              cVar1 = *pcVar12;
              pcVar12 = operator()(__return_storage_ptr__,my,mx,x,y);
              *pcVar12 = cVar1;
            }
          }
        }
      }
    }
    else {
      local_a9 = '\0';
      this_01 = fill(__return_storage_ptr__,&local_a9);
      draw_image(this_01,-ny0,-nz0,-nc0,-local_50,this,1.0);
    }
  }
  else {
    draw_image(__return_storage_ptr__,-ny0,-nz0,-nc0,-local_50,this,1.0);
  }
  return __return_storage_ptr__;
}

Assistant:

CImg<T> get_crop(const int x0, const int y0, const int z0, const int c0,
                     const int x1, const int y1, const int z1, const int c1,
                     const unsigned int boundary_conditions=0) const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "crop(): Empty instance.",
                                    cimg_instance);
      const int
        nx0 = x0<x1?x0:x1, nx1 = x0^x1^nx0,
        ny0 = y0<y1?y0:y1, ny1 = y0^y1^ny0,
        nz0 = z0<z1?z0:z1, nz1 = z0^z1^nz0,
        nc0 = c0<c1?c0:c1, nc1 = c0^c1^nc0;
      CImg<T> res(1U + nx1 - nx0,1U + ny1 - ny0,1U + nz1 - nz0,1U + nc1 - nc0);
      if (nx0<0 || nx1>=width() || ny0<0 || ny1>=height() || nz0<0 || nz1>=depth() || nc0<0 || nc1>=spectrum())
        switch (boundary_conditions) {
        case 3 : { // Mirror
          const int w2 = 2*width(), h2 = 2*height(), d2 = 2*depth(), s2 = 2*spectrum();
          cimg_pragma_openmp(parallel for cimg_openmp_collapse(3) cimg_openmp_if(_width>=(cimg_openmp_sizefactor)*16 &&
                                                                     _height*_depth*_spectrum>=4))
          cimg_forXYZC(res,x,y,z,c) {
            const int
              mx = cimg::mod(nx0 + x,w2),
              my = cimg::mod(ny0 + y,h2),
              mz = cimg::mod(nz0 + z,d2),
              mc = cimg::mod(nc0 + c,s2);
            res(x,y,z,c) = (*this)(mx<width()?mx:w2 - mx - 1,
                                   my<height()?my:h2 - my - 1,
                                   mz<depth()?mz:d2 - mz - 1,
                                   mc<spectrum()?mc:s2 - mc - 1);
          }
        } break;
        case 2 : { // Periodic
          cimg_pragma_openmp(parallel for cimg_openmp_collapse(3) cimg_openmp_if(_width>=(cimg_openmp_sizefactor)*16 &&
                                                                     _height*_depth*_spectrum>=4))
          cimg_forXYZC(res,x,y,z,c) {
            res(x,y,z,c) = (*this)(cimg::mod(nx0 + x,width()),cimg::mod(ny0 + y,height()),
                                   cimg::mod(nz0 + z,depth()),cimg::mod(nc0 + c,spectrum()));
          }
        } break;
        case 1 : // Neumann
          cimg_pragma_openmp(parallel for cimg_openmp_collapse(3) cimg_openmp_if(_width>=(cimg_openmp_sizefactor)*16 &&
                                                                     _height*_depth*_spectrum>=4))
          cimg_forXYZC(res,x,y,z,c) res(x,y,z,c) = _atXYZC(nx0 + x,ny0 + y,nz0 + z,nc0 + c);
          break;
        default : // Dirichlet
          res.fill((T)0).draw_image(-nx0,-ny0,-nz0,-nc0,*this);
        }
      else res.draw_image(-nx0,-ny0,-nz0,-nc0,*this);
      return res;
    }